

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationData::getGroupForPrimary(CollationData *this,uint32_t p)

{
  uint uVar1;
  int local_28;
  int local_24;
  int32_t i_1;
  int32_t i;
  int32_t index;
  uint32_t p_local;
  CollationData *this_local;
  
  uVar1 = p >> 0x10;
  if ((this->scriptStarts[1] <= uVar1) &&
     (uVar1 < this->scriptStarts[this->scriptStartsLength + -1])) {
    i_1 = 1;
    while (this->scriptStarts[i_1 + 1] <= uVar1) {
      i_1 = i_1 + 1;
    }
    for (local_24 = 0; local_24 < this->numScripts; local_24 = local_24 + 1) {
      if ((uint)this->scriptsIndex[local_24] == i_1) {
        return local_24;
      }
    }
    for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
      if ((uint)this->scriptsIndex[this->numScripts + local_28] == i_1) {
        return local_28 + 0x1000;
      }
    }
  }
  return -1;
}

Assistant:

int32_t
CollationData::getGroupForPrimary(uint32_t p) const {
    p >>= 16;
    if(p < scriptStarts[1] || scriptStarts[scriptStartsLength - 1] <= p) {
        return -1;
    }
    int32_t index = 1;
    while(p >= scriptStarts[index + 1]) { ++index; }
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            return i;
        }
    }
    for(int32_t i = 0; i < MAX_NUM_SPECIAL_REORDER_CODES; ++i) {
        if(scriptsIndex[numScripts + i] == index) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    return -1;
}